

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_if_statement(Parser *this)

{
  Symbol_Table *pSVar1;
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  string local_80;
  string local_60;
  int local_3c;
  Symbol_Table *local_38;
  
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t\t<if_statement>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pSVar1 = &this->symbol_table;
  local_3c = Symbol_Table::get_label_count(pSVar1);
  VM_Writer::write_if(this->vm_writer,local_3c);
  Symbol_Table::increment_label_count(pSVar1);
  Symbol_Table::increment_label_count(pSVar1);
  paVar2 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"(","");
  paVar3 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"if statement","");
  check_expected_x_after_y(this,&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_38 = pSVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  __rhs = &this->cur_token;
  std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80.field_2._8_8_ = plVar6[3];
    local_80._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_80._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  query_tokenizer(this);
  parse_expression(this);
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,")","");
  local_60._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"expression","");
  check_expected_x_after_y(this,&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80.field_2._8_8_ = plVar6[3];
    local_80._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_80._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  query_tokenizer(this);
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{","");
  local_60._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,")","");
  check_expected_x_after_y(this,&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80.field_2._8_8_ = plVar6[3];
    local_80._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_80._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  query_tokenizer(this);
  parse_statements(this);
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
  local_60._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"statements","");
  check_expected_x_after_y(this,&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  poVar7 = (ostream *)this->out_file;
  std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80.field_2._8_8_ = plVar6[3];
    local_80._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_80._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  query_tokenizer(this);
  iVar4 = std::__cxx11::string::compare((char *)__rhs);
  iVar5 = local_3c;
  if (iVar4 == 0) {
    poVar7 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t\t<else_statement>",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    VM_Writer::write_label(this->vm_writer,local_3c);
    query_tokenizer(this);
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{","");
    local_60._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"else statement","");
    check_expected_x_after_y(this,&local_80,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar3) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    poVar7 = (ostream *)this->out_file;
    std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80.field_2._8_8_ = plVar6[3];
      local_80._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_80._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar3) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    query_tokenizer(this);
    iVar5 = Tokenizer::get_keyword_val(this->tokenizer,__rhs);
    if ((iVar5 < 9) && (iVar5 = Tokenizer::get_keyword_val(this->tokenizer,__rhs), 0xe < iVar5)) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Expected a statement after {");
      std::endl<char,std::char_traits<char>>(poVar7);
      exit(0);
    }
    parse_statements(this);
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
    local_60._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"statements","");
    check_expected_x_after_y(this,&local_80,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar3) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    poVar7 = (ostream *)this->out_file;
    std::operator+(&local_60,"\t\t\t\t<symbol>",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80.field_2._8_8_ = plVar6[3];
      local_80._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar8;
      local_80._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_80._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pSVar1 = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    iVar5 = local_3c + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar3) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    VM_Writer::write_goto(this->vm_writer,iVar5);
    Symbol_Table::increment_label_count(pSVar1);
    query_tokenizer(this);
  }
  VM_Writer::write_label(this->vm_writer,iVar5);
  poVar7 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t\t</if_statement>",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::parse_if_statement() {
    out_file << "\t\t\t<if_statement>" << std::endl;

    int label_count = symbol_table.get_label_count();
    vm_writer.write_if(label_count);
    // reserve two labels for each potential if-else pair
    symbol_table.increment_label_count();
    symbol_table.increment_label_count();


    check_expected_x_after_y("(", "if statement");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_expression();

    check_expected_x_after_y(")", "expression");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    check_expected_x_after_y("{", ")");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_statements();

    check_expected_x_after_y("}", "statements");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    if (cur_token == "else") {
        out_file << "\t\t\t<else_statement>" << std::endl;
        vm_writer.write_label(label_count);
        label_count++;
        query_tokenizer();

        check_expected_x_after_y("{", "else statement");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();

        if (tokenizer.get_keyword_val(cur_token) < LET && tokenizer.get_keyword_val(cur_token) > DO) {
            std::cerr << "Expected a statement after {" << std::endl;
            exit(0);
        }
        parse_statements();

        check_expected_x_after_y("}", "statements");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        vm_writer.write_goto(label_count);

        // increment for the next (potential) if statement
        symbol_table.increment_label_count();
        query_tokenizer();
    }

    vm_writer.write_label(label_count);
    out_file << "\t\t\t</if_statement>" << std::endl;
}